

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_noop(NetOptimize *this)

{
  int iVar1;
  value_type pLVar2;
  value_type pLVar3;
  FILE *__stream;
  bool bVar4;
  size_type sVar5;
  reference ppLVar6;
  reference pvVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  reference pvVar11;
  long in_RDI;
  int top_blob_index_final;
  Layer *any;
  size_t k;
  size_t top_blob_count_1;
  bool link_noop;
  int any_k;
  int j;
  int bottom_blob_index;
  int top_blob_index_final_1;
  size_t j_1;
  size_t top_blob_count;
  Layer *noop;
  size_t i;
  size_t layer_count;
  char *in_stack_ffffffffffffff68;
  FILE *in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  size_type local_58;
  int local_40;
  int local_3c;
  size_type local_30;
  size_type local_18;
  
  sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_18 = 0;
  do {
    if (sVar5 <= local_18) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_18);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (!bVar4) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58),local_18);
      pLVar2 = *ppLVar6;
      bVar4 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
      __stream = _stderr;
      if (bVar4) {
        uVar9 = std::__cxx11::string::c_str();
        fprintf(__stream,"eliminate_noop %s\n",uVar9);
        sVar8 = std::vector<int,_std::allocator<int>_>::size(&pLVar2->tops);
        for (local_30 = 0; local_30 < sVar8; local_30 = local_30 + 1) {
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,local_30);
          pvVar11 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                               (long)*pvVar7);
          pvVar11->producer = -1;
        }
        std::__cxx11::string::operator=((string *)&pLVar2->type,"ncnnfused");
      }
      else {
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->bottoms,0);
        iVar1 = *pvVar7;
        local_3c = (int)local_18;
        local_40 = -1;
        do {
          do {
            local_3c = local_3c + -1;
            if (local_3c < 0) goto LAB_0014a442;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       (long)local_3c);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          } while (bVar4);
          bVar4 = false;
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),(long)local_3c);
          sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->tops);
          for (local_58 = 0; local_58 < sVar8; local_58 = local_58 + 1) {
            ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                  (in_RDI + 0x58),(long)local_3c);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,local_58);
            if (*pvVar7 == iVar1) {
              bVar4 = true;
              local_40 = (int)local_58;
              break;
            }
          }
        } while (!bVar4);
LAB_0014a442:
        if ((local_3c != -1) && (local_40 != -1)) {
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                (in_RDI + 0x58),(long)local_3c);
          pLVar3 = *ppLVar6;
          in_stack_ffffffffffffff70 = _stderr;
          uVar9 = std::__cxx11::string::c_str();
          uVar10 = std::__cxx11::string::c_str();
          fprintf(in_stack_ffffffffffffff70,"eliminate_noop %s %s\n",uVar9,uVar10);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar2->tops,0);
          iVar1 = *pvVar7;
          in_stack_ffffffffffffff80 = iVar1;
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar3->tops,(long)local_40);
          *pvVar7 = in_stack_ffffffffffffff80;
          pvVar11 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                               (long)iVar1);
          pvVar11->producer = local_3c;
          std::__cxx11::string::operator=((string *)&pLVar2->type,"ncnnfused");
          in_stack_ffffffffffffff84 = local_3c;
        }
      }
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_noop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Noop")
            continue;

        ncnn::Layer* noop = layers[i];

        if (noop->bottoms.empty())
        {
            // Noop
            fprintf(stderr, "eliminate_noop %s\n", noop->name.c_str());

            size_t top_blob_count = noop->tops.size();
            for (size_t j = 0; j < top_blob_count; j++)
            {
                int top_blob_index_final = noop->tops[j];
                blobs[top_blob_index_final].producer = -1;
            }
            noop->type = "ncnnfused";

            continue;
        }

        // Any - Noop
        int bottom_blob_index = noop->bottoms[0];

        int j = i - 1;
        int any_k = -1;
        for (; j >= 0; j--)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool link_noop = false;
            size_t top_blob_count = layers[j]->tops.size();
            for (size_t k = 0; k < top_blob_count; k++)
            {
                if (layers[j]->tops[k] == bottom_blob_index)
                {
                    link_noop = true;
                    any_k = k;
                    break;
                }
            }

            if (link_noop)
                break;
        }

        if (j == -1 || any_k == -1)
            continue;

        ncnn::Layer* any = layers[j];

        fprintf(stderr, "eliminate_noop %s %s\n", any->name.c_str(), noop->name.c_str());

        int top_blob_index_final = noop->tops[0];
        any->tops[any_k] = top_blob_index_final;
        blobs[top_blob_index_final].producer = j;

        noop->type = "ncnnfused";
    }

    return 0;
}